

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_buffered_collector.cpp
# Opt level: O1

SinkResultType __thiscall
duckdb::PhysicalBufferedCollector::Sink
          (PhysicalBufferedCollector *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSinkInput *input)

{
  pthread_mutex_t *__mutex;
  _Atomic_word *p_Var1;
  GlobalSinkState *pGVar2;
  InterruptState *pIVar3;
  bool bVar4;
  int iVar5;
  BufferedData *this_00;
  SimpleBufferedData *this_01;
  SinkResultType SVar6;
  InterruptState callback_state;
  InterruptState local_50;
  
  pGVar2 = input->global_state;
  __mutex = (pthread_mutex_t *)(pGVar2 + 1);
  iVar5 = pthread_mutex_lock(__mutex);
  if (iVar5 == 0) {
    this_00 = shared_ptr<duckdb::BufferedData,_true>::operator->
                        ((shared_ptr<duckdb::BufferedData,_true> *)
                         &pGVar2[1].super_StateWithBlockableTasks.blocked_tasks);
    this_01 = BufferedData::Cast<duckdb::SimpleBufferedData>(this_00);
    bVar4 = SimpleBufferedData::BufferIsFull(this_01);
    if (bVar4) {
      pIVar3 = input->interrupt_state;
      local_50.mode = pIVar3->mode;
      local_50.current_task.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (pIVar3->current_task).internal.
               super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_50.current_task.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (pIVar3->current_task).internal.
           super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (local_50.current_task.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_50.current_task.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_weak_count =
               (local_50.current_task.internal.
                super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               _M_weak_count + 1;
          UNLOCK();
        }
        else {
          (local_50.current_task.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_weak_count =
               (local_50.current_task.internal.
                super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               _M_weak_count + 1;
        }
      }
      local_50.signal_state.internal.
      super___weak_ptr<duckdb::InterruptDoneSignalState,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (pIVar3->signal_state).internal.
           super___weak_ptr<duckdb::InterruptDoneSignalState,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_50.signal_state.internal.
      super___weak_ptr<duckdb::InterruptDoneSignalState,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (pIVar3->signal_state).internal.
              super___weak_ptr<duckdb::InterruptDoneSignalState,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
      if (local_50.signal_state.internal.
          super___weak_ptr<duckdb::InterruptDoneSignalState,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_50.signal_state.internal.
           super___weak_ptr<duckdb::InterruptDoneSignalState,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_weak_count =
               (local_50.signal_state.internal.
                super___weak_ptr<duckdb::InterruptDoneSignalState,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_weak_count + 1;
          UNLOCK();
        }
        else {
          (local_50.signal_state.internal.
           super___weak_ptr<duckdb::InterruptDoneSignalState,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_weak_count =
               (local_50.signal_state.internal.
                super___weak_ptr<duckdb::InterruptDoneSignalState,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_weak_count + 1;
        }
      }
      SimpleBufferedData::BlockSink(this_01,&local_50);
      if (local_50.signal_state.internal.
          super___weak_ptr<duckdb::InterruptDoneSignalState,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1 = &(local_50.signal_state.internal.
                     super___weak_ptr<duckdb::InterruptDoneSignalState,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_weak_count;
          iVar5 = *p_Var1;
          *p_Var1 = *p_Var1 + -1;
          UNLOCK();
        }
        else {
          iVar5 = (local_50.signal_state.internal.
                   super___weak_ptr<duckdb::InterruptDoneSignalState,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_weak_count;
          (local_50.signal_state.internal.
           super___weak_ptr<duckdb::InterruptDoneSignalState,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_weak_count = iVar5 + -1;
        }
        if (iVar5 == 1) {
          (*(local_50.signal_state.internal.
             super___weak_ptr<duckdb::InterruptDoneSignalState,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
        }
      }
      if (local_50.current_task.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1 = &(local_50.current_task.internal.
                     super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                    _M_weak_count;
          iVar5 = *p_Var1;
          *p_Var1 = *p_Var1 + -1;
          UNLOCK();
        }
        else {
          iVar5 = (local_50.current_task.internal.
                   super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                  _M_weak_count;
          (local_50.current_task.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_weak_count = iVar5 + -1;
        }
        if (iVar5 == 1) {
          (*(local_50.current_task.internal.
             super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _vptr__Sp_counted_base[3])();
        }
      }
      SVar6 = BLOCKED;
    }
    else {
      SimpleBufferedData::Append(this_01,chunk);
      SVar6 = NEED_MORE_INPUT;
    }
    pthread_mutex_unlock(__mutex);
    return SVar6;
  }
  ::std::__throw_system_error(iVar5);
}

Assistant:

SinkResultType PhysicalBufferedCollector::Sink(ExecutionContext &context, DataChunk &chunk,
                                               OperatorSinkInput &input) const {
	auto &gstate = input.global_state.Cast<BufferedCollectorGlobalState>();
	auto &lstate = input.local_state.Cast<BufferedCollectorLocalState>();
	(void)lstate;

	lock_guard<mutex> l(gstate.glock);
	auto &buffered_data = gstate.buffered_data->Cast<SimpleBufferedData>();

	if (buffered_data.BufferIsFull()) {
		auto callback_state = input.interrupt_state;
		buffered_data.BlockSink(callback_state);
		return SinkResultType::BLOCKED;
	}
	buffered_data.Append(chunk);
	return SinkResultType::NEED_MORE_INPUT;
}